

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O0

ssize_t bsplib::UIntSerialize<unsigned_int>::write(int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  uint uVar2;
  undefined4 local_1c;
  uchar c;
  uchar m;
  int i;
  Buffer *bytes_local;
  uint x_local;
  
  local_1c = 0;
  bytes_local._4_4_ = __fd;
  do {
    bVar1 = (byte)bytes_local._4_4_;
    bytes_local._4_4_ = bytes_local._4_4_ >> 7;
    uVar2 = local_1c + 1;
    *(byte *)((long)__buf + (long)(int)local_1c) = bVar1 & 0x7f | (bytes_local._4_4_ != 0) * -0x80;
    local_1c = uVar2;
  } while (bytes_local._4_4_ != 0);
  return (ulong)uVar2;
}

Assistant:

static int write( UInt x, Buffer & bytes ) {
        assert( x >= 0 );
        int i = 0;
        do {
            unsigned char m = (1 << (CHAR_BIT-1));
            unsigned char c = x & (m-1); // cut out least significant bits
            x >>= (CHAR_BIT-1);          // and save these in c
            c |= (x > 0) * m ;  // set highest signif. bit if continuing
            bytes[i++] = c;
        } while ( x != 0 );
        return i;
    }